

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O0

int telnet_exitcode(Backend *be)

{
  Telnet *telnet;
  Backend *be_local;
  
  if (be[-10].vt == (BackendVtable *)0x0) {
    if (((ulong)be[-10].interactor & 0x100) == 0) {
      be_local._4_4_ = 0;
    }
    else {
      be_local._4_4_ = 0x7fffffff;
    }
  }
  else {
    be_local._4_4_ = -1;
  }
  return be_local._4_4_;
}

Assistant:

static int telnet_exitcode(Backend *be)
{
    Telnet *telnet = container_of(be, Telnet, backend);
    if (telnet->s != NULL)
        return -1;                     /* still connected */
    else if (telnet->closed_on_socket_error)
        return INT_MAX;     /* a socket error counts as an unclean exit */
    else
        /* Telnet doesn't transmit exit codes back to the client */
        return 0;
}